

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# schemeobject.h
# Opt level: O2

void __thiscall
TailContext::TailContext
          (TailContext *this,shared_ptr<SchemeProcedure> *func,
          list<std::shared_ptr<SchemeObject>,_std::allocator<std::shared_ptr<SchemeObject>_>_> *args
          )

{
  std::__shared_ptr<SchemeProcedure,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
            ((__shared_ptr<SchemeProcedure,_(__gnu_cxx::_Lock_policy)2> *)this,
             &func->super___shared_ptr<SchemeProcedure,_(__gnu_cxx::_Lock_policy)2>);
  std::__cxx11::list<std::shared_ptr<SchemeObject>,_std::allocator<std::shared_ptr<SchemeObject>_>_>
  ::list(&this->args,args);
  return;
}

Assistant:

TailContext(const std::shared_ptr<SchemeProcedure> &func, const std::list<std::shared_ptr<SchemeObject>> &args) :
        func(func), args(args)
    {}